

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

quad_value_bit_vector *
bsim::xorr(quad_value_bit_vector *__return_storage_ptr__,quad_value_bit_vector *a)

{
  uchar uVar1;
  long lVar2;
  bool bVar3;
  string local_30;
  
  if (0 < (long)a->N) {
    lVar2 = 0;
    bVar3 = false;
    do {
      uVar1 = (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar2].value;
      if (uVar1 == '\x03') {
        __assert_fail("!a.is_high_impedance()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0x101,"bool bsim::operator==(const quad_value &, const quad_value &)");
      }
      bVar3 = (bool)(bVar3 ^ uVar1 == '\x01');
      lVar2 = lVar2 + 1;
    } while (a->N != lVar2);
    if (bVar3) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"1","");
      quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,1,&local_30);
      goto LAB_00187622;
    }
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"0","");
  quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,1,&local_30);
LAB_00187622:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline quad_value_bit_vector
  xorr(const quad_value_bit_vector& a) {
    int numSet = 0;
    for (int i = 0; i < a.bitLength(); i++) {
      if (a.get(i) == 1) {
	numSet++;
      }
    }

    if ((numSet % 2) == 0) {
      return quad_value_bit_vector(1, "0");
    }

    return quad_value_bit_vector(1, "1");
  }